

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O3

void __thiscall
Component_onlyOneParentAtAnyGivenTime_Test::~Component_onlyOneParentAtAnyGivenTime_Test
          (Component_onlyOneParentAtAnyGivenTime_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Component, onlyOneParentAtAnyGivenTime)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr parent = libcellml::Component::create();
    parent->setName("parent_component");
    libcellml::ComponentPtr child1 = libcellml::Component::create();
    child1->setName("child1");
    libcellml::ComponentPtr child2 = libcellml::Component::create();
    child2->setName("child2");
    libcellml::ComponentPtr child3 = libcellml::Component::create();
    child3->setName("child3");

    parent->addComponent(child1);
    parent->addComponent(child2);
    parent->addComponent(child3);
    model->addComponent(parent);

    EXPECT_EQ(size_t(3), parent->componentCount());
    EXPECT_EQ(size_t(0), child2->componentCount());

    child2->addComponent(child3);

    EXPECT_EQ(size_t(2), parent->componentCount());
    EXPECT_EQ(size_t(1), child2->componentCount());
}